

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O3

void __thiscall
icu_63::UTF8CollationIterator::forwardNumCodePoints
          (UTF8CollationIterator *this,int32_t num,UErrorCode *param_2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *puVar4;
  int iVar5;
  int32_t __N;
  int iVar6;
  int32_t iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (0 < num) {
    uVar3 = this->length;
    puVar4 = this->u8;
    iVar7 = this->pos;
    iVar6 = num + 1;
    do {
      lVar8 = (long)iVar7;
      if ((int)uVar3 <= iVar7) {
        if (-1 < (int)uVar3) {
          return;
        }
        if (puVar4[lVar8] == '\0') {
          return;
        }
      }
      uVar9 = lVar8 + 1;
      this->pos = (uint)uVar9;
      bVar1 = puVar4[lVar8];
      if ((0xcc < (byte)(bVar1 + 0xb)) && ((uint)uVar9 != uVar3)) {
        bVar2 = puVar4[uVar9];
        if ((bVar1 & 0xf0) == 0xe0) {
          if (((byte)" 000000000000\x1000"[bVar1 & 0xf] >> (bVar2 >> 5) & 1) != 0) {
            uVar10 = (long)iVar7 + 2;
            this->pos = (uint)uVar10;
            uVar9 = (ulong)uVar3;
            if ((uint)uVar10 != uVar3) {
              iVar5 = 3;
              bVar2 = puVar4[uVar10];
              uVar9 = uVar10 & 0xffffffff;
              goto joined_r0x00227098;
            }
          }
        }
        else if (bVar1 < 0xe0) {
          iVar5 = 2;
joined_r0x00227098:
          if ((char)bVar2 < -0x40) {
            this->pos = iVar7 + iVar5;
            uVar9 = (ulong)(uint)(iVar7 + iVar5);
          }
        }
        else if (((byte)""[bVar2 >> 4] >> (bVar1 & 7) & 1) != 0) {
          uVar10 = (long)iVar7 + 2;
          this->pos = (uint)uVar10;
          uVar9 = (ulong)uVar3;
          if (((uint)uVar10 != uVar3) && (uVar9 = uVar10 & 0xffffffff, (char)puVar4[uVar10] < -0x40)
             ) {
            uVar10 = (long)iVar7 + 3;
            this->pos = (uint)uVar10;
            uVar9 = (ulong)uVar3;
            if ((uint)uVar10 != uVar3) {
              iVar5 = 4;
              bVar2 = puVar4[uVar10];
              uVar9 = uVar10 & 0xffffffff;
              goto joined_r0x00227098;
            }
          }
        }
      }
      iVar6 = iVar6 + -1;
      iVar7 = (int32_t)uVar9;
    } while (1 < iVar6);
  }
  return;
}

Assistant:

void
UTF8CollationIterator::forwardNumCodePoints(int32_t num, UErrorCode & /*errorCode*/) {
    U8_FWD_N(u8, pos, length, num);
}